

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBPolynomial(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,
                  float *poly,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_float_ptr_int *ARGBPolynomialRow;
  int y;
  code *pcVar2;
  int local_38;
  uint local_34;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = ARGBPolynomialRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
     (((int)in_R9D < 1 || ((int)ARGBPolynomialRow == 0)))) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if ((int)ARGBPolynomialRow < 0) {
      ARGBPolynomialRow._0_4_ = -(int)ARGBPolynomialRow;
      local_10 = in_RDI + ((int)ARGBPolynomialRow + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    if ((local_14 == in_R9D << 2) && (in_ECX == in_R9D << 2)) {
      local_34 = (int)ARGBPolynomialRow * in_R9D;
      ARGBPolynomialRow._0_4_ = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && ((local_34 & 1) == 0)) {
      pcVar2 = ARGBPolynomialRow_SSE2;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if (iVar1 != 0) {
      iVar1 = libyuv::TestCpuFlag(0);
      if ((iVar1 != 0) && ((local_34 & 1) == 0)) {
        pcVar2 = ARGBPolynomialRow_AVX2;
      }
    }
    local_20 = in_RDX;
    for (local_38 = 0; local_38 < (int)ARGBPolynomialRow; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,in_R8,local_34);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBPolynomial(const uint8_t* src_argb,
                   int src_stride_argb,
                   uint8_t* dst_argb,
                   int dst_stride_argb,
                   const float* poly,
                   int width,
                   int height) {
  int y;
  void (*ARGBPolynomialRow)(const uint8_t* src_argb, uint8_t* dst_argb,
                            const float* poly, int width) = ARGBPolynomialRow_C;
  if (!src_argb || !dst_argb || !poly || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBPOLYNOMIALROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 2)) {
    ARGBPolynomialRow = ARGBPolynomialRow_SSE2;
  }
#endif
#if defined(HAS_ARGBPOLYNOMIALROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2) && TestCpuFlag(kCpuHasFMA3) &&
      IS_ALIGNED(width, 2)) {
    ARGBPolynomialRow = ARGBPolynomialRow_AVX2;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBPolynomialRow(src_argb, dst_argb, poly, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}